

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_audio.c
# Opt level: O3

void ws_audio_reset(void *info)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  wsa_state *chip;
  byte *pbVar4;
  
  pbVar4 = (byte *)((long)info + 0x15);
  lVar2 = 0;
  uVar1 = 0;
  do {
    uVar1 = uVar1 | (uint)*pbVar4 << ((byte)lVar2 & 0x1f);
    lVar2 = lVar2 + 1;
    pbVar4 = pbVar4 + 0x10;
  } while (lVar2 != 4);
  *(undefined8 *)((long)info + 8) = 0;
  *(undefined8 *)((long)info + 0x10) = 0;
  lVar2 = (long)info + 0x15;
  lVar3 = 0;
  do {
    *(bool *)lVar2 = (uVar1 >> ((uint)lVar3 & 0x1f) & 1) != 0;
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 0x10;
  } while (lVar3 != 4);
  *(undefined2 *)((long)info + 0x58) = 0;
  *(undefined1 *)((long)info + 0x5a) = 0;
  *(undefined1 *)((long)info + 0x60) = 0;
  *(undefined8 *)((long)info + 100) = 0x200000001;
  *(undefined8 *)((long)info + 0x50) = 0;
  lVar2 = 0x80;
  do {
    ws_audio_port_write(info,(UINT8)lVar2,""[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xc9);
  return;
}

Assistant:

static void ws_audio_reset(void* info)
{
	wsa_state* chip = (wsa_state*)info;
	UINT32 muteMask;
	int i;
	
	muteMask = ws_get_mute_mask(chip);
	memset(&chip->ws_audio, 0, sizeof(WS_AUDIO));
	ws_set_mute_mask(chip, muteMask);
	
	chip->SweepTime = 0;
	chip->SweepStep = 0;
	chip->NoiseType = 0;
	chip->NoiseRng = 1;
	chip->MainVolume = 0x02;	// 0x04
	chip->PCMVolumeLeft = 0;
	chip->PCMVolumeRight = 0;
	
	RC_RESET(&chip->HBlankTmr);
	
	for (i=0x80;i<0xc9;i++)
		ws_audio_port_write(chip, i, initialIoValue[i]);
}